

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.c
# Opt level: O2

int process_metadata(WavpackContext *wpc,WavpackMetadata *wpmd)

{
  WavpackStream *wps;
  byte bVar1;
  undefined1 *puVar2;
  ushort uVar3;
  uint3 uVar4;
  int iVar5;
  
  bVar1 = wpmd->id;
  if (bVar1 < 0xe) {
    wps = &wpc->stream;
    switch(bVar1) {
    default:
      return 1;
    case 1:
      goto switchD_0019f072_caseD_1;
    case 2:
      iVar5 = read_decorr_terms(wps,wpmd);
      return iVar5;
    case 3:
      iVar5 = read_decorr_weights(wps,wpmd);
      return iVar5;
    case 4:
      iVar5 = read_decorr_samples(wps,wpmd);
      return iVar5;
    case 5:
      iVar5 = read_entropy_vars(wps,wpmd);
      return iVar5;
    case 6:
      iVar5 = read_hybrid_profile(wps,wpmd);
      return iVar5;
    case 8:
      iVar5 = read_float_info(wps,wpmd);
      return iVar5;
    case 9:
      iVar5 = read_int32_info(wps,wpmd);
      return iVar5;
    case 10:
      iVar5 = init_wv_bitstream(wpc,wpmd);
      return iVar5;
    case 0xd:
      iVar5 = read_channel_info(wpc,wpmd);
      return iVar5;
    }
  }
  if (bVar1 != 0x25) {
switchD_0019f072_caseD_1:
    return bVar1 >> 5 & 1;
  }
  if (2 < wpmd->byte_length) {
    puVar2 = (undefined1 *)wpmd->data;
    bVar1 = (byte)(wpc->config).flags;
    (wpc->config).flags = (uint)bVar1;
    uVar3 = CONCAT11(*puVar2,bVar1);
    (wpc->config).flags = (uint)uVar3;
    uVar4 = CONCAT12(puVar2[1],uVar3);
    (wpc->config).flags = (uint)uVar4;
    (wpc->config).flags = CONCAT13(puVar2[2],uVar4);
  }
  return 1;
}

Assistant:

int process_metadata (WavpackContext *wpc, WavpackMetadata *wpmd)
{
    WavpackStream *wps = &wpc->stream;

    switch (wpmd->id) {
        case ID_DUMMY:
            return TRUE;

        case ID_DECORR_TERMS:
            return read_decorr_terms (wps, wpmd);

        case ID_DECORR_WEIGHTS:
            return read_decorr_weights (wps, wpmd);

        case ID_DECORR_SAMPLES:
            return read_decorr_samples (wps, wpmd);

        case ID_ENTROPY_VARS:
            return read_entropy_vars (wps, wpmd);

        case ID_HYBRID_PROFILE:
            return read_hybrid_profile (wps, wpmd);

        case ID_FLOAT_INFO:
            return read_float_info (wps, wpmd);

        case ID_INT32_INFO:
            return read_int32_info (wps, wpmd);

        case ID_CHANNEL_INFO:
            return read_channel_info (wpc, wpmd);

        case ID_CONFIG_BLOCK:
            return read_config_info (wpc, wpmd);

        case ID_WV_BITSTREAM:
            return init_wv_bitstream (wpc, wpmd);

        case ID_SHAPING_WEIGHTS:
        case ID_WVC_BITSTREAM:
        case ID_WVX_BITSTREAM:
            return TRUE;

        default:
            return (wpmd->id & ID_OPTIONAL_DATA) ? TRUE : FALSE;
    }
}